

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_epoll.c
# Opt level: O2

int notify_no_fd_interrupt(int epfd,epoll_event *events,int maxevents,int timeout)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  
  uVar2 = epoll_wait_fake.call_count;
  piVar3 = __errno_location();
  iVar1 = 0x16;
  if (uVar2 == 1) {
    iVar1 = 4;
  }
  *piVar3 = iVar1;
  return -1;
}

Assistant:

static int notify_no_fd_interrupt(int epfd, struct epoll_event *events,
                                  int maxevents, int timeout)
{
	(void)epfd;
	(void)maxevents;
	(void)timeout;
	(void)events;

	if (epoll_wait_fake.call_count == 1) {
		errno = EINTR;
		return -1;
	} else {
		errno = EINVAL;
		return -1;
	}
}